

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i8255.hpp
# Opt level: O0

ssize_t __thiscall
Intel::i8255::
i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>::write
          (i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>
           *this,int __fd,void *__buf,size_t __n)

{
  byte value;
  uint uVar1;
  ulong uVar2;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  uint8_t value_local;
  int address_local;
  i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>
  *this_local;
  
  value = (byte)__buf;
  uVar1 = __fd & 3;
  uVar2 = (ulong)(uVar1 - 3);
  if (uVar1 < 3 || uVar1 - 3 == 0) {
    switch(uVar1) {
    case 0:
      uVar2 = (ulong)(this->control_ & 0x10);
      if ((this->control_ & 0x10) == 0) {
        this->outputs_[0] = value;
        MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler::
        set_value(this->port_handler_,0,value);
        uVar2 = extraout_RAX;
      }
      break;
    case 1:
      uVar2 = (ulong)(this->control_ & 2);
      if ((this->control_ & 2) == 0) {
        this->outputs_[1] = value;
        MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler::
        set_value(this->port_handler_,1,value);
        uVar2 = extraout_RAX_00;
      }
      break;
    case 2:
      this->outputs_[2] = value;
      MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler::
      set_value(this->port_handler_,2,value);
      uVar2 = extraout_RAX_01;
      break;
    case 3:
      if (((ulong)__buf & 0x80) == 0) {
        if (((ulong)__buf & 1) == 0) {
          this->outputs_[2] =
               this->outputs_[2] & ((byte)(1 << ((byte)((int)(uint)value >> 1) & 7)) ^ 0xff);
        }
        else {
          this->outputs_[2] = this->outputs_[2] | (byte)(1 << ((byte)((int)(uint)value >> 1) & 7));
        }
      }
      else {
        this->control_ = value;
      }
      update_outputs(this);
      uVar2 = extraout_RAX_02;
    }
  }
  return uVar2;
}

Assistant:

void write(int address, uint8_t value) {
			switch(address & 3) {
				case 0:
					if(!(control_ & 0x10)) {
						// TODO: so what would output be when switching from input to output mode?
						outputs_[0] = value; port_handler_.set_value(0, value);
					}
				break;
				case 1:
					if(!(control_ & 0x02)) {
						outputs_[1] = value; port_handler_.set_value(1, value);
					}
				break;
				case 2:	outputs_[2] = value; port_handler_.set_value(2, value);	break;
				case 3:
					if(value & 0x80) {
						control_ = value;
					} else {
						if(value & 1) {
							outputs_[2] |= 1 << ((value >> 1)&7);
						} else {
							outputs_[2] &= ~(1 << ((value >> 1)&7));
						}
					}
					update_outputs();
				break;
			}
		}